

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseFile(Parser *this,TextFile *file,bool virtualFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  uint in_ECX;
  undefined7 in_register_00000011;
  EVP_PKEY_CTX *ctx;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *result;
  FileTokenizer tokenizer;
  FileTokenizer local_168;
  
  ctx = (EVP_PKEY_CTX *)CONCAT71(in_register_00000011,virtualFile);
  Tokenizer::Tokenizer(&local_168.super_Tokenizer);
  paVar1 = &local_168.currentLine.field_2;
  local_168.currentLine._M_string_length = 0;
  local_168.currentLine.field_2._M_local_buf[0] = '\0';
  local_168.token.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
  .super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_index =
       '\0';
  paVar2 = &local_168.token.originalText.field_2;
  local_168.token.line = 0;
  local_168.token.column._0_5_ = 0;
  local_168.token.column._5_3_ = 0;
  local_168.token.type = Invalid;
  local_168.token.checked = false;
  local_168.token.originalText._M_string_length = 0;
  local_168.token.originalText.field_2._M_local_buf[0] = '\0';
  local_168.currentLine._M_dataplus._M_p = (pointer)paVar1;
  local_168.token.originalText._M_dataplus._M_p = (pointer)paVar2;
  iVar3 = FileTokenizer::init(&local_168,ctx);
  if ((char)iVar3 == '\0') {
    (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    parse(this,(Tokenizer *)file,SUB81(&local_168,0),(path *)((ulong)in_ECX & 0xff));
    if (ctx[0x269] == (EVP_PKEY_CTX)0x0) {
      Global.FileInfo.TotalLineCount = Global.FileInfo.TotalLineCount + *(int *)(ctx + 0x298);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.token.originalText._M_dataplus._M_p != paVar2) {
    operator_delete(local_168.token.originalText._M_dataplus._M_p,
                    CONCAT71(local_168.token.originalText.field_2._M_allocated_capacity._1_7_,
                             local_168.token.originalText.field_2._M_local_buf[0]) + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
  ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                     *)&local_168.token.value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.currentLine._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.currentLine._M_dataplus._M_p,
                    CONCAT71(local_168.currentLine.field_2._M_allocated_capacity._1_7_,
                             local_168.currentLine.field_2._M_local_buf[0]) + 1);
  }
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::~vector
            (&local_168.super_Tokenizer.replacements);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.super_Tokenizer.invalidToken.originalText._M_dataplus._M_p !=
      &local_168.super_Tokenizer.invalidToken.originalText.field_2) {
    operator_delete(local_168.super_Tokenizer.invalidToken.originalText._M_dataplus._M_p,
                    local_168.super_Tokenizer.invalidToken.originalText.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
  ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                     *)&local_168.super_Tokenizer.invalidToken.value);
  std::__cxx11::_List_base<Token,_std::allocator<Token>_>::_M_clear
            ((_List_base<Token,_std::allocator<Token>_> *)&local_168);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseFile(TextFile& file, bool virtualFile)
{
	FileTokenizer tokenizer;
	if (!tokenizer.init(&file))
		return nullptr;

	std::unique_ptr<CAssemblerCommand> result = parse(&tokenizer,virtualFile,file.getFileName());

	if (!file.isFromMemory())
		Global.FileInfo.TotalLineCount += file.getNumLines();

	return result;
}